

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O2

char * __thiscall icu_63::IslamicCalendar::getType(IslamicCalendar *this)

{
  ulong uVar1;
  
  uVar1 = (ulong)*(uint *)&(this->super_Calendar).field_0x264;
  if (uVar1 < 4) {
    return &DAT_0030f968 + *(int *)(&DAT_0030f968 + uVar1 * 4);
  }
  return "islamic";
}

Assistant:

const char *IslamicCalendar::getType() const {
    const char *sType = NULL;

    switch (cType) {
    case CIVIL:
        sType = "islamic-civil";
        break;
    case ASTRONOMICAL:
        sType = "islamic";
        break;
    case TBLA:
        sType = "islamic-tbla";
        break;
    case UMALQURA:
        sType = "islamic-umalqura";
        break;
    default:
        U_ASSERT(false); // out of range
        sType = "islamic";  // "islamic" is used as the generic type
        break;
    }
    return sType;
}